

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O0

size_t fiobj_json2obj(FIOBJ *pobj,void *data,size_t len)

{
  size_t sVar1;
  FIOBJ o;
  size_t consumed;
  fiobj_json_parser_s p;
  size_t len_local;
  void *data_local;
  FIOBJ *pobj_local;
  
  p._64_8_ = len;
  memset(&consumed,0,0x48);
  sVar1 = fio_json_parse((json_parser_s *)&consumed,(char *)data,p._64_8_);
  if ((sVar1 == 0) || (consumed._4_1_ != '\0')) {
    o = fio_json_stack_get((fio_json_stack_s *)&p.target,0);
    fiobj_free(o);
    p.key = 0;
  }
  fio_json_stack_free((fio_json_stack_s *)&p.target);
  fiobj_free((FIOBJ)p.p);
  *pobj = p.key;
  return sVar1;
}

Assistant:

size_t fiobj_json2obj(FIOBJ *pobj, const void *data, size_t len) {
  fiobj_json_parser_s p = {.top = FIOBJ_INVALID};
  size_t consumed = fio_json_parse(&p.p, data, len);
  if (!consumed || p.p.depth) {
    fiobj_free(fio_json_stack_get(&p.stack, 0));
    p.top = FIOBJ_INVALID;
  }
  fio_json_stack_free(&p.stack);
  fiobj_free(p.key);
  *pobj = p.top;
  return consumed;
}